

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxx_eventlistener.hpp
# Opt level: O0

void __thiscall
mxx_gtest::MpiTestEventListener::OnTestEnd(MpiTestEventListener *this,TestInfo *test_info)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  TestResult *pTVar4;
  TestPartResult *pTVar5;
  char *pcVar6;
  undefined8 uVar7;
  istream *piVar8;
  ostream *poVar9;
  Message *message_00;
  AssertHelper local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  Message local_428;
  string local_420 [8];
  string linestr;
  stringstream ss;
  ostream local_3f0 [376];
  istringstream local_278 [8];
  istringstream iss;
  undefined4 local_f4;
  undefined1 local_f0 [4];
  int len;
  MPI_Status stat;
  string message;
  string filename_1;
  int local_90;
  int line_1;
  int i_1;
  int p;
  int end;
  string msg;
  allocator<char> local_49;
  string local_48 [8];
  string filename;
  int local_20;
  int line;
  int i;
  int count;
  TestInfo *test_info_local;
  MpiTestEventListener *this_local;
  
  if (this->rank == 0) {
    MPI_Comm_size(&ompi_mpi_comm_world,&line_1);
    for (local_90 = 1; local_90 < line_1; local_90 = local_90 + 1) {
      std::__cxx11::string::string((string *)(message.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&stat._ucount);
      MPI_Recv((undefined1 *)((long)&filename_1.field_2 + 0xc),1,&ompi_mpi_int,local_90,0,
               &ompi_mpi_comm_world,0);
      while (filename_1.field_2._12_4_ != -0xd) {
        MPI_Probe(local_90,0,&ompi_mpi_comm_world,local_f0);
        MPI_Get_count(local_f0,&ompi_mpi_char,&local_f4);
        std::__cxx11::string::resize((ulong)((long)&message.field_2 + 8));
        uVar7 = std::__cxx11::string::operator[]((ulong)((long)&message.field_2 + 8));
        MPI_Recv(uVar7,local_f4,&ompi_mpi_char,local_90,0,&ompi_mpi_comm_world,0);
        MPI_Probe(local_90,0,&ompi_mpi_comm_world,local_f0);
        MPI_Get_count(local_f0,&ompi_mpi_char,&local_f4);
        std::__cxx11::string::resize((ulong)&stat._ucount);
        uVar7 = std::__cxx11::string::operator[]((ulong)&stat._ucount);
        MPI_Recv(uVar7,local_f4,&ompi_mpi_char,local_90,0,&ompi_mpi_comm_world,0);
        std::__cxx11::istringstream::istringstream(local_278,&stat._ucount,8);
        std::__cxx11::stringstream::stringstream((stringstream *)(linestr.field_2._M_local_buf + 8))
        ;
        std::__cxx11::string::string(local_420);
        while( true ) {
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_278,local_420);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
          if (!bVar1) break;
          poVar9 = std::operator<<(local_3f0,"[Rank ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_90);
          poVar9 = std::operator<<(poVar9,"] ");
          poVar9 = std::operator<<(poVar9,local_420);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        testing::Message::Message(&local_428);
        std::__cxx11::stringstream::str();
        message_00 = testing::Message::operator<<(&local_428,&local_448);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_450,kNonFatalFailure,pcVar6,filename_1.field_2._12_4_,"Failed");
        testing::internal::AssertHelper::operator=(&local_450,message_00);
        testing::internal::AssertHelper::~AssertHelper(&local_450);
        std::__cxx11::string::~string((string *)&local_448);
        testing::Message::~Message(&local_428);
        MPI_Recv((undefined1 *)((long)&filename_1.field_2 + 0xc),1,&ompi_mpi_int,local_90,0,
                 &ompi_mpi_comm_world,0);
        std::__cxx11::string::~string(local_420);
        std::__cxx11::stringstream::~stringstream
                  ((stringstream *)(linestr.field_2._M_local_buf + 8));
        std::__cxx11::istringstream::~istringstream(local_278);
      }
      std::__cxx11::string::~string((string *)&stat._ucount);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
  }
  else {
    pTVar4 = testing::TestInfo::result(test_info);
    bVar1 = testing::TestResult::Passed(pTVar4);
    if (!bVar1) {
      pTVar4 = testing::TestInfo::result(test_info);
      iVar2 = testing::TestResult::total_part_count(pTVar4);
      for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
        pTVar4 = testing::TestInfo::result(test_info);
        pTVar5 = testing::TestResult::GetTestPartResult(pTVar4,local_20);
        bVar1 = testing::TestPartResult::passed(pTVar5);
        if (!bVar1) {
          pTVar4 = testing::TestInfo::result(test_info);
          pTVar5 = testing::TestResult::GetTestPartResult(pTVar4,local_20);
          filename.field_2._12_4_ = testing::TestPartResult::line_number(pTVar5);
          pTVar4 = testing::TestInfo::result(test_info);
          pTVar5 = testing::TestResult::GetTestPartResult(pTVar4,local_20);
          pcVar6 = testing::TestPartResult::file_name(pTVar5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar6,&local_49);
          std::allocator<char>::~allocator(&local_49);
          pTVar4 = testing::TestInfo::result(test_info);
          pTVar5 = testing::TestResult::GetTestPartResult(pTVar4,local_20);
          pcVar6 = testing::TestPartResult::message(pTVar5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&end,pcVar6,(allocator<char> *)((long)&p + 3));
          std::allocator<char>::~allocator((allocator<char> *)((long)&p + 3));
          MPI_Send((undefined1 *)((long)&filename.field_2 + 0xc),1,&ompi_mpi_int,0,0,
                   &ompi_mpi_comm_world);
          uVar7 = std::__cxx11::string::operator[]((ulong)local_48);
          uVar3 = std::__cxx11::string::size();
          MPI_Send(uVar7,uVar3,&ompi_mpi_char,0,0,&ompi_mpi_comm_world);
          uVar7 = std::__cxx11::string::operator[]((ulong)&end);
          uVar3 = std::__cxx11::string::size();
          MPI_Send(uVar7,uVar3,&ompi_mpi_char,0,0,&ompi_mpi_comm_world);
          std::__cxx11::string::~string((string *)&end);
          std::__cxx11::string::~string(local_48);
        }
      }
    }
    i_1 = -0xd;
    MPI_Send(&i_1,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
  }
  if (this->rank == 0) {
    (*this->other->_vptr_TestEventListener[9])(this->other,test_info);
  }
  return;
}

Assistant:

virtual void OnTestEnd(const TestInfo& test_info)
    {
        // serialze all failed TestPartResults and send to rank 0
        // there, receive and ADD_FAILURE_AT() for the remote error

        // first send lineno, since -1 is used by google for unknown line numbers
        // we use -13 for "no more fails"
        if (rank != 0) {
            if (!test_info.result()->Passed()) {
                int count = test_info.result()->total_part_count();
                for (int i = 0; i < count; ++i) {
                    if (!test_info.result()->GetTestPartResult(i).passed()) {
                        // get result information for failed tests
                        int line = test_info.result()->GetTestPartResult(i).line_number();
                        std::string filename(test_info.result()->GetTestPartResult(i).file_name());
                        std::string msg(test_info.result()->GetTestPartResult(i).message());
                        // send info to rank 0
                        // TODO: replace with mxx calls?
                        // TODO: custom communicator?
                        // TODO: use custom `tag`? currently all are tag `0`
                        MPI_Send(&line, 1, MPI_INT, 0, 0, MPI_COMM_WORLD);
                        MPI_Send(&filename[0], filename.size(), MPI_CHAR, 0, 0, MPI_COMM_WORLD);
                        MPI_Send(&msg[0], msg.size(), MPI_CHAR, 0, 0, MPI_COMM_WORLD);
                    }
                }
            }
            // send the END message (line = -13)
            int end = -13;
            MPI_Send(&end, 1, MPI_INT, 0, 0, MPI_COMM_WORLD);
        } else {
            // rank 0: in a for loop over all ranks, receive the failing messages
            int p;
            MPI_Comm_size(MPI_COMM_WORLD, &p);
            for (int i = 1; i < p; ++i)
            {
                int line;
                std::string filename;
                std::string message;
                MPI_Recv(&line, 1, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                while (line != -13) {
                    // receive filename and message
                    // TODO: use mxx std::string overloads for recv
                    MPI_Status stat;
                    int len;
                    // filename
                    MPI_Probe(i, 0, MPI_COMM_WORLD, &stat);
                    MPI_Get_count(&stat, MPI_CHAR, &len);
                    filename.resize(len);
                    MPI_Recv(&filename[0], len, MPI_CHAR, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                    // message
                    MPI_Probe(i, 0, MPI_COMM_WORLD, &stat);
                    MPI_Get_count(&stat, MPI_CHAR, &len);
                    message.resize(len);
                    MPI_Recv(&message[0], len, MPI_CHAR, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

                    // modify message, add `[Rank x]` in front of each line
                    std::istringstream iss(message);
                    std::stringstream ss;
                    std::string linestr;
                    while (std::getline(iss, linestr)) {
                        ss << "[Rank " << i << "] " << linestr << std::endl;
                    }
                    ADD_FAILURE_AT(filename.c_str(), line) << ss.str();

                    // receive next line or end message
                    MPI_Recv(&line, 1, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                }
            }
        }
        if (rank == 0)
          other->OnTestEnd(test_info);
    }